

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
WriteFor(BitpackingWriter *this,hugeint_t *values,bool *validity,bitpacking_width_t width,
        hugeint_t frame_of_reference,idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  unsigned_long uVar5;
  uint64_t *puVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar8;
  ulong uVar9;
  ulong count_00;
  ulong value;
  ulong uVar10;
  uhugeint_t *in;
  hugeint_t local_248;
  uhugeint_t local_238;
  undefined1 local_228 [504];
  
  count_00 = frame_of_reference.upper;
  uVar7 = count_00;
  if (((undefined1  [16])frame_of_reference & (undefined1  [16])0x1f) != (undefined1  [16])0x0) {
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                      ((uint)frame_of_reference.upper & 0x1f);
    uVar7 = (count_00 - uVar5) + 0x20;
  }
  value = (ulong)validity & 0xff;
  uVar7 = uVar7 * value >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)count,
             uVar7 + 0x20,4);
  iVar1 = *(int *)(count + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(count + 0x38));
  lVar3 = *(long *)(count + 0x48);
  iVar2 = *(int *)(*(long *)(count + 0x38) + 0x10);
  *(long *)(count + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x5000000;
  puVar4 = *(undefined8 **)(count + 0x40);
  *puVar4 = CONCAT71(in_register_00000009,width);
  puVar4[1] = frame_of_reference.lower;
  *(undefined8 **)(count + 0x40) = puVar4 + 2;
  hugeint_t::hugeint_t(&local_248,value);
  puVar6 = *(uint64_t **)(count + 0x40);
  *puVar6 = local_248.lower;
  puVar6[1] = local_248.upper;
  puVar6 = puVar6 + 2;
  *(uint64_t **)(count + 0x40) = puVar6;
  uVar10 = count_00 & 0xffffffffffffffe0;
  if (((undefined1  [16])frame_of_reference & (undefined1  [16])0xffffffffffffffe0) !=
      (undefined1  [16])0x0) {
    uVar9 = 0;
    uVar8 = 0;
    in = (uhugeint_t *)this;
    do {
      HugeIntPacker::Pack(in,(uint32_t *)((uVar9 >> 3) + (long)puVar6),(bitpacking_width_t)validity)
      ;
      uVar8 = uVar8 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (uint)((int)value << 5);
    } while (uVar8 < uVar10);
  }
  if (((undefined1  [16])frame_of_reference & (undefined1  [16])0x1f) != (undefined1  [16])0x0) {
    hugeint_t::hugeint_t((hugeint_t *)&local_238,0);
    switchD_0105b559::default(local_228,0,0x1f0);
    switchD_015ff80e::default
              (&local_238,this + uVar10 * 0x10,(ulong)(((uint)frame_of_reference.upper & 0x1f) << 4)
              );
    HugeIntPacker::Pack(&local_238,(uint32_t *)((long)puVar6 + (value * uVar10 >> 3)),
                        (bitpacking_width_t)validity);
  }
  *(long *)(count + 0x40) = *(long *)(count + 0x40) + uVar7;
  UpdateStats((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)count,
              count_00);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}